

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMutableRenderBufferTests.cpp
# Opt level: O0

int __thiscall
deqp::egl::MutableRenderBufferTests::init(MutableRenderBufferTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  MutableRenderBufferTest *this_00;
  MutableRenderBufferTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x1ad0);
  anon_unknown_3::MutableRenderBufferQueryTest::MutableRenderBufferQueryTest
            ((MutableRenderBufferQueryTest *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx,
             "querySurface",
             "Tests if querySurface returns the correct value after surfaceAttrib is called");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x1ad0);
  anon_unknown_3::MutableRenderBufferQueryNegativeTest::MutableRenderBufferQueryNegativeTest
            ((MutableRenderBufferQueryNegativeTest *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx
             ,"negativeConfigBit",
             "Tests trying to enable single-buffering on a context without the mutable render buffer bit set"
            );
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_00 = (MutableRenderBufferTest *)operator_new(0x1ad0);
  anon_unknown_3::MutableRenderBufferTest::MutableRenderBufferTest
            (this_00,(this->super_TestCaseGroup).m_eglTestCtx,"basic",
             "Tests enabling/disabling single-buffer rendering and checks the buffering behavior",
             true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  return extraout_EAX;
}

Assistant:

void MutableRenderBufferTests::init (void)
{
	addChild(new MutableRenderBufferQueryTest(m_eglTestCtx, "querySurface",
		"Tests if querySurface returns the correct value after surfaceAttrib is called"));
	addChild(new MutableRenderBufferQueryNegativeTest(m_eglTestCtx, "negativeConfigBit",
		"Tests trying to enable single-buffering on a context without the mutable render buffer bit set"));
	addChild(new MutableRenderBufferTest(m_eglTestCtx, "basic",
		"Tests enabling/disabling single-buffer rendering and checks the buffering behavior", true));
}